

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

void __thiscall
icu_63::TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
          (TimeArrayTimeZoneRule *this,UnicodeString *name,int32_t rawOffset,int32_t dstSavings,
          UDate *startTimes,int32_t numStartTimes,TimeRuleType timeRuleType)

{
  UErrorCode local_30;
  int32_t local_2c;
  UErrorCode status;
  int32_t numStartTimes_local;
  UDate *startTimes_local;
  int32_t dstSavings_local;
  int32_t rawOffset_local;
  UnicodeString *name_local;
  TimeArrayTimeZoneRule *this_local;
  
  local_2c = numStartTimes;
  _status = startTimes;
  startTimes_local._0_4_ = dstSavings;
  startTimes_local._4_4_ = rawOffset;
  _dstSavings_local = name;
  name_local = (UnicodeString *)this;
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,name,rawOffset,dstSavings);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TimeArrayTimeZoneRule_004ddeb8;
  this->fTimeRuleType = timeRuleType;
  this->fStartTimes = (UDate *)0x0;
  local_30 = U_ZERO_ERROR;
  initStartTimes(this,_status,local_2c,&local_30);
  return;
}

Assistant:

TimeArrayTimeZoneRule::TimeArrayTimeZoneRule(const UnicodeString& name,
                                             int32_t rawOffset,
                                             int32_t dstSavings,
                                             const UDate* startTimes,
                                             int32_t numStartTimes,
                                             DateTimeRule::TimeRuleType timeRuleType)
: TimeZoneRule(name, rawOffset, dstSavings), fTimeRuleType(timeRuleType),
  fStartTimes(NULL) {
    UErrorCode status = U_ZERO_ERROR;
    initStartTimes(startTimes, numStartTimes, status);
    //TODO - status?
}